

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

ITracker * __thiscall
Catch::TestCaseTracking::ITracker::findChild(ITracker *this,NameAndLocationRef *nameAndLocation)

{
  bool bVar1;
  pointer this_00;
  ITracker *local_50;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  local_40;
  unique_ptr<Catch::TestCaseTracking::ITracker> *local_38;
  unique_ptr<Catch::TestCaseTracking::ITracker> *local_30;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  local_28;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  local_20;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  it;
  NameAndLocationRef *nameAndLocation_local;
  ITracker *this_local;
  
  it._M_current = (unique_ptr<Catch::TestCaseTracking::ITracker> *)nameAndLocation;
  local_28._M_current =
       (unique_ptr<Catch::TestCaseTracking::ITracker> *)
       std::
       vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
       ::begin(&this->m_children);
  local_30 = (unique_ptr<Catch::TestCaseTracking::ITracker> *)
             std::
             vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
             ::end(&this->m_children);
  local_38 = it._M_current;
  local_20 = std::
             find_if<__gnu_cxx::__normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>*,std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>>>>,Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::__0>
                       (local_28,(__normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
                                  )local_30,(anon_class_8_1_9c565101_for__M_pred)it._M_current);
  local_40._M_current =
       (unique_ptr<Catch::TestCaseTracking::ITracker> *)
       std::
       vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
       ::end(&this->m_children);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_40);
  if (bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
              ::operator->(&local_20);
    local_50 = Detail::unique_ptr<Catch::TestCaseTracking::ITracker>::get(this_00);
  }
  else {
    local_50 = (ITracker *)0x0;
  }
  return local_50;
}

Assistant:

ITracker* ITracker::findChild( NameAndLocationRef const& nameAndLocation ) {
        auto it = std::find_if(
            m_children.begin(),
            m_children.end(),
            [&nameAndLocation]( ITrackerPtr const& tracker ) {
                auto const& tnameAndLoc = tracker->nameAndLocation();
                if ( tnameAndLoc.location.line !=
                     nameAndLocation.location.line ) {
                    return false;
                }
                return tnameAndLoc == nameAndLocation;
            } );
        return ( it != m_children.end() ) ? it->get() : nullptr;
    }